

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Graph_map(MPIABI_Comm comm,int nnodes,int *index,int *edges,int *newrank)

{
  int iVar1;
  
  iVar1 = MPI_Graph_map();
  return iVar1;
}

Assistant:

int MPIABI_Graph_map(
  MPIABI_Comm comm,
  int nnodes,
  const int * index,
  const int * edges,
  int * newrank
) {
  return MPI_Graph_map(
    (MPI_Comm)(WPI_Comm)comm,
    nnodes,
    index,
    edges,
    newrank
  );
}